

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# undo_dialog_box.cpp
# Opt level: O2

void clear_all_line_same(Am_Object *scroll_menu)

{
  bool bVar1;
  Am_Value *pAVar2;
  Am_Object sel;
  Am_Value_List sel_list;
  
  pAVar2 = Am_Object::Get(scroll_menu,0x171,3);
  Am_Value_List::Am_Value_List(&sel_list,pAVar2);
  bVar1 = Am_Value_List::Valid(&sel_list);
  if (bVar1) {
    sel.data = (Am_Object_Data *)0x0;
    Am_Value_List::Start(&sel_list);
    while( true ) {
      bVar1 = Am_Value_List::Last(&sel_list);
      if (bVar1) break;
      pAVar2 = Am_Value_List::Get(&sel_list);
      Am_Object::operator=(&sel,pAVar2);
      set_text_leaf_parts(&sel,&Am_No_Style);
      Am_Value_List::Next(&sel_list);
    }
    Am_Object::~Am_Object(&sel);
  }
  Am_Value_List::~Am_Value_List(&sel_list);
  return;
}

Assistant:

void
clear_all_line_same(Am_Object &scroll_menu)
{
  Am_Value_List sel_list =
      scroll_menu.Get(Am_SAVED_OLD_OBJECT_OWNER, Am_RETURN_ZERO_ON_ERROR);
  if (sel_list.Valid()) {
    Am_Object sel;
    for (sel_list.Start(); !sel_list.Last(); sel_list.Next()) {
      sel = sel_list.Get();
      set_text_leaf_parts(sel, Am_No_Style);
    }
  }
}